

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O3

void __thiscall
cppjieba::KeywordExtractor::Extract
          (KeywordExtractor *this,string *sentence,
          vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
          *keywords,size_t topN)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  iterator __position;
  __normal_iterator<cppjieba::KeywordExtractor::Word_*,_std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>_>
  __first;
  const_iterator cVar5;
  mapped_type *pmVar6;
  const_iterator cVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  pointer pbVar12;
  _func_bool_Word_ptr_Word_ptr *p_Var13;
  long lVar14;
  __normal_iterator<cppjieba::KeywordExtractor::Word_*,_std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>_>
  _Var15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>_>_>
  wordmap;
  size_t t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  size_t local_1f0;
  string *local_1e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>_>_>
  local_1e0;
  code *local_1b0 [48];
  
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = topN;
  local_1e8 = sentence;
  MixSegment::Cut(&this->segment_,sentence,&local_208,true);
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e0._M_impl.super__Rb_tree_header._M_header;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var13 = (_func_bool_Word_ptr_Word_ptr *)0x0;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar14 = 0;
    p_Var13 = (_func_bool_Word_ptr_Word_ptr *)0x0;
    uVar11 = 0;
    pbVar12 = local_208.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pbVar3 = *(byte **)((long)&(pbVar12->_M_dataplus)._M_p + lVar14);
      uVar4 = *(ulong *)((long)&pbVar12->_M_string_length + lVar14);
      if (uVar4 == 0 || pbVar3 == (byte *)0x0) {
        uVar9 = 0;
      }
      else {
        bVar2 = *pbVar3;
        uVar9 = 1;
        if ((((char)bVar2 < '\0') && (uVar9 = 2, uVar4 < 2 || 0xdf < bVar2)) &&
           (uVar9 = 3, uVar4 < 3 || 0xef < bVar2)) {
          uVar9 = (ulong)(3 < uVar4 && bVar2 < 0xf8) << 2;
        }
      }
      local_1b0[0] = p_Var13;
      if (uVar9 != uVar4) {
        cVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->stopWords_)._M_h,
                       (key_type *)((long)&(pbVar12->_M_dataplus)._M_p + lVar14));
        pbVar12 = local_208.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (cVar5.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>_>_>
                                 *)&local_1e0,
                                (key_type *)
                                ((long)&((local_208.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar14));
          __position._M_current =
               (pmVar6->offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pmVar6->offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pmVar6->offsets,
                       __position,(unsigned_long *)local_1b0);
          }
          else {
            *__position._M_current = (unsigned_long)local_1b0[0];
            (pmVar6->offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>_>_>
                                 *)&local_1e0,
                                (key_type *)
                                ((long)&((local_208.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar14));
          pmVar6->weight = pmVar6->weight + 1.0;
          pbVar12 = local_208.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      p_Var13 = p_Var13 + uVar4;
      uVar11 = uVar11 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar11 < (ulong)((long)local_208.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5)
            );
  }
  if (p_Var13 == (_func_bool_Word_ptr_Word_ptr *)local_1e8->_M_string_length) {
    std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
    ::_M_erase_at_end(keywords,(keywords->
                               super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
    ::reserve(keywords,local_1e0._M_impl.super__Rb_tree_header._M_node_count);
    p_Var1 = &local_1e0._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_1e0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var8 = local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        cVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->idfMap_)._M_h,(key_type *)(p_Var8 + 1));
        pdVar10 = (double *)
                  ((long)cVar7.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                         ._M_cur + 0x28);
        if (cVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
            ._M_cur == (__node_type *)0x0) {
          pdVar10 = &this->idfAverage_;
        }
        p_Var8[3]._M_right = (_Base_ptr)(*pdVar10 * (double)p_Var8[3]._M_right);
        std::__cxx11::string::_M_assign((string *)(p_Var8 + 2));
        std::
        vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
        ::push_back(keywords,(value_type *)(p_Var8 + 2));
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    __first._M_current =
         (keywords->
         super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var15._M_current =
         (keywords->
         super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = (long)_Var15._M_current - (long)__first._M_current >> 6;
    if (local_1f0 <= uVar11) {
      uVar11 = local_1f0;
    }
    lVar14 = uVar11 * 0x40;
    local_1b0[0] = Compare;
    std::
    __heap_select<__gnu_cxx::__normal_iterator<cppjieba::KeywordExtractor::Word*,std::vector<cppjieba::KeywordExtractor::Word,std::allocator<cppjieba::KeywordExtractor::Word>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cppjieba::KeywordExtractor::Word_const&,cppjieba::KeywordExtractor::Word_const&)>>
              (__first,__first._M_current + uVar11,_Var15,
               (_Iter_comp_iter<bool_(*)(const_cppjieba::KeywordExtractor::Word_&,_const_cppjieba::KeywordExtractor::Word_&)>
                )0x10f4d6);
    if (1 < (long)uVar11) {
      _Var15._M_current = __first._M_current + uVar11;
      do {
        _Var15._M_current = _Var15._M_current + -1;
        std::
        __pop_heap<__gnu_cxx::__normal_iterator<cppjieba::KeywordExtractor::Word*,std::vector<cppjieba::KeywordExtractor::Word,std::allocator<cppjieba::KeywordExtractor::Word>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cppjieba::KeywordExtractor::Word_const&,cppjieba::KeywordExtractor::Word_const&)>>
                  (__first,_Var15,_Var15,
                   (_Iter_comp_iter<bool_(*)(const_cppjieba::KeywordExtractor::Word_&,_const_cppjieba::KeywordExtractor::Word_&)>
                    *)local_1b0);
        lVar14 = lVar14 + -0x40;
      } while (0x40 < lVar14);
    }
    std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
    ::resize(keywords,uVar11);
  }
  else {
    limonp::Logger::Logger
              ((Logger *)local_1b0,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/KeywordExtractor.hpp"
               ,0x4a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"words illegal",0xd);
    limonp::Logger::~Logger((Logger *)local_1b0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppjieba::KeywordExtractor::Word>_>_>
  ::~_Rb_tree(&local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  return;
}

Assistant:

void Extract(const string& sentence, vector<Word>& keywords, size_t topN) const {
    vector<string> words;
    segment_.Cut(sentence, words);

    map<string, Word> wordmap;
    size_t offset = 0;
    for (size_t i = 0; i < words.size(); ++i) {
      size_t t = offset;
      offset += words[i].size();
      if (IsSingleWord(words[i]) || stopWords_.find(words[i]) != stopWords_.end()) {
        continue;
      }
      wordmap[words[i]].offsets.push_back(t);
      wordmap[words[i]].weight += 1.0;
    }
    if (offset != sentence.size()) {
      XLOG(ERROR) << "words illegal";
      return;
    }

    keywords.clear();
    keywords.reserve(wordmap.size());
    for (map<string, Word>::iterator itr = wordmap.begin(); itr != wordmap.end(); ++itr) {
      unordered_map<string, double>::const_iterator cit = idfMap_.find(itr->first);
      if (cit != idfMap_.end()) {
        itr->second.weight *= cit->second;
      } else {
        itr->second.weight *= idfAverage_;
      }
      itr->second.word = itr->first;
      keywords.push_back(itr->second);
    }
    topN = min(topN, keywords.size());
    partial_sort(keywords.begin(), keywords.begin() + topN, keywords.end(), Compare);
    keywords.resize(topN);
  }